

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

void __thiscall tinyxml2::XMLElement::DeleteAttribute(XMLElement *this,char *name)

{
  bool bVar1;
  char *q;
  XMLAttribute *in_RSI;
  long in_RDI;
  XMLAttribute *a;
  XMLAttribute *prev;
  XMLAttribute *attribute;
  long local_20;
  long local_18;
  
  local_18 = 0;
  local_20 = *(long *)(in_RDI + 0x60);
  while( true ) {
    if (local_20 == 0) {
      return;
    }
    attribute = in_RSI;
    q = XMLAttribute::Name((XMLAttribute *)0x2c4d5a);
    bVar1 = XMLUtil::StringEqual((char *)attribute,q,0x7fffffff);
    if (bVar1) break;
    local_18 = local_20;
    local_20 = *(long *)(local_20 + 0x38);
  }
  if (local_18 == 0) {
    *(undefined8 *)(in_RDI + 0x60) = *(undefined8 *)(local_20 + 0x38);
  }
  else {
    *(undefined8 *)(local_18 + 0x38) = *(undefined8 *)(local_20 + 0x38);
  }
  DeleteAttribute(attribute);
  return;
}

Assistant:

void XMLElement::DeleteAttribute( const char* name )
{
    XMLAttribute* prev = 0;
    for( XMLAttribute* a=_rootAttribute; a; a=a->_next ) {
        if ( XMLUtil::StringEqual( name, a->Name() ) ) {
            if ( prev ) {
                prev->_next = a->_next;
            }
            else {
                _rootAttribute = a->_next;
            }
            DeleteAttribute( a );
            break;
        }
        prev = a;
    }
}